

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O3

packet_t * new_udp_pkt(char *src_ip,char *dst_ip,uint16_t src_port,uint16_t dst_port)

{
  udp_t *puVar1;
  packet_t *pkt;
  double __x;
  double extraout_XMM0_Qa;
  double __x_00;
  
  pkt = parse_pkt(default_udp,0x2a);
  if (pkt == (packet_t *)0x0) {
    _log(__x);
  }
  else {
    __x_00 = __x;
    if ((pkt->eth_type == 0x800) && (pkt->ip != (ip_t *)0x0)) {
      inet_pton(2,src_ip,&pkt->ip->src);
      inet_pton(2,dst_ip,&pkt->ip->dst);
      __x_00 = extraout_XMM0_Qa;
      if ((pkt->ip_proto == '\x11') && (puVar1 = pkt->udp, puVar1 != (udp_t *)0x0)) {
        puVar1->src = src_port << 8 | src_port >> 8;
        puVar1->dst = dst_port << 8 | dst_port >> 8;
        return pkt;
      }
    }
    _log(__x_00);
    free_pkt(pkt);
  }
  return (packet_t *)0x0;
}

Assistant:

packet_t *new_udp_pkt(const char *src_ip, const char *dst_ip, uint16_t src_port, uint16_t dst_port)
{
	packet_t *pkt = parse_pkt(default_udp, sizeof(default_udp));

	if (pkt == NULL) {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		return NULL;
	}

	if (pkt->eth_type == ETH_IP && pkt->ip) {
		inet_pton(AF_INET, src_ip, (struct in_addr *)&pkt->ip->src);
		inet_pton(AF_INET, dst_ip, (struct in_addr *)&pkt->ip->dst);
	} else {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		free_pkt(pkt);
		return NULL;
	}

	if (pkt->ip_proto == IPPROTO_UDP && pkt->udp) {
		pkt->udp->src = htons(src_port);
		pkt->udp->dst = htons(dst_port);
	} else {
		log_err("%s %d failed\n", __FUNCTION__, __LINE__);
		free_pkt(pkt);
		return NULL;
	}

	return pkt;
}